

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetbios.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  uint uVar3;
  FILE *__stream_00;
  int *piVar4;
  int32_t strap_peek;
  FILE *strap_peek_output;
  int length;
  int result;
  char *source;
  int cnum;
  int c;
  uint8_t vbios [1048576];
  char **argv_local;
  int argc_local;
  
  __stream_00 = _stderr;
  source._0_4_ = 0;
  _length = (char *)0x0;
  strap_peek_output._4_4_ = 0;
  iVar2 = nva_init();
  if (iVar2 == 0) {
    while (source._4_4_ = getopt(argc,argv,"hc:s:S:"), source._4_4_ != -1) {
      switch(source._4_4_) {
      case 0x53:
        __stream_00 = fopen(_optarg,"w+");
        __stream = _stderr;
        pcVar1 = _optarg;
        if (__stream_00 == (FILE *)0x0) {
          piVar4 = __errno_location();
          _length = strerror(*piVar4);
          fprintf(__stream,"-S: Error while opening %s: %s\n",pcVar1,_length);
          return 1;
        }
        break;
      case 99:
        __isoc99_sscanf(_optarg,"%d",&source);
        break;
      case 0x68:
        usage(0);
        break;
      case 0x73:
        _length = _optarg;
      }
    }
    if ((int)source < nva_cardsnum) {
      if (_length == (char *)0x0) {
        fprintf(_stderr,
                "No extraction method specified (using -s extraction_method). Autodetecting.\n");
        if ((nva_cards[(int)source]->chipset).chipset < 4) {
          strap_peek_output._4_4_ =
               vbios_extract_prom((int)source,(uint8_t *)&cnum,(int *)&strap_peek_output);
        }
        else {
          strap_peek_output._4_4_ =
               vbios_extract_pramin((int)source,(uint8_t *)&cnum,(int *)&strap_peek_output);
          if (strap_peek_output._4_4_ != 1) {
            strap_peek_output._4_4_ =
                 vbios_extract_prom((int)source,(uint8_t *)&cnum,(int *)&strap_peek_output);
          }
        }
        if (strap_peek_output._4_4_ != 1) {
          fprintf(_stderr,"Autodetection failed, aborting.\n");
          return 1;
        }
      }
      else {
        iVar2 = strcasecmp(_length,"pramin");
        if (iVar2 == 0) {
          strap_peek_output._4_4_ =
               vbios_extract_pramin((int)source,(uint8_t *)&cnum,(int *)&strap_peek_output);
          if (strap_peek_output._4_4_ == -2) {
            fprintf(_stderr,"You may want to run nvagetbios -s prom instead!\n");
          }
        }
        else {
          iVar2 = strcasecmp(_length,"prom");
          if (iVar2 == 0) {
            strap_peek_output._4_4_ =
                 vbios_extract_prom((int)source,(uint8_t *)&cnum,(int *)&strap_peek_output);
          }
          else {
            fprintf(_stderr,"Unknown vbios extraction method.\n");
            usage(1);
          }
        }
      }
      iVar2 = fileno(_stdout);
      iVar2 = isatty(iVar2);
      if (iVar2 == 0) {
        fwrite(&cnum,1,(long)(int)strap_peek_output,_stdout);
      }
      else {
        fprintf(_stderr,
                "Refusing to write BIOS image to a terminal - please redirect output to a file.\n");
      }
      uVar3 = extract_strap_peek((int)source);
      iVar2 = fileno(__stream_00);
      iVar2 = isatty(iVar2);
      if (iVar2 == 0) {
        fprintf(__stream_00,"0x%x",(ulong)uVar3);
      }
      else {
        fprintf(__stream_00,
                "Your strap peek is: 0x%x\nPlease save this value in the same directory as your vbios as a file named strap_peek (or use -S)\n"
                ,(ulong)uVar3);
      }
      if (strap_peek_output._4_4_ == 1) {
        fprintf(_stderr,"Vbios extracted successfully!\n");
      }
      else if (strap_peek_output._4_4_ == -2) {
        fprintf(_stderr,"Vbios extracted but it may be corrupted!\n");
      }
      argv_local._4_4_ = (uint)(strap_peek_output._4_4_ != 1);
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      argv_local._4_4_ = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	uint8_t vbios[NV_PROM_SIZE];
	int c;
	int cnum =0;
	char const *source = NULL;
	int result = 0;
	int length;
	FILE *strap_peek_output = stderr;
	int32_t strap_peek;

	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}

	/* Arguments parsing */
	while ((c = getopt (argc, argv, "hc:s:S:")) != -1) {
		switch (c) {
			case 'h':
				usage(0);
				break;
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 's':
				source = optarg;
				break;
			case 'S':
				strap_peek_output = fopen(optarg, "w+");
				if (!strap_peek_output) {
					fprintf(stderr, "-S: Error while opening %s: %s\n",
						optarg, strerror(errno));
					return 1;
				}
				break;
		}
	}

	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	/* Extraction */
	if (!source) {
		fprintf(stderr, "No extraction method specified (using -s extraction_method). Autodetecting.\n");
		if (nva_cards[cnum]->chipset.chipset < 4) {
			result = vbios_extract_prom(cnum, vbios, &length);
		} else {
			result = vbios_extract_pramin(cnum, vbios, &length);
			if (result != EOK)
				result = vbios_extract_prom(cnum, vbios, &length);
		}

		if (result != EOK) {
			fprintf(stderr, "Autodetection failed, aborting.\n");
			return 1;
		}
	}
	else if (strcasecmp(source, "pramin") == 0) {
		result = vbios_extract_pramin(cnum, vbios, &length);
		if (result == ESIG)
			fprintf(stderr, "You may want to run nvagetbios -s prom instead!\n");
	}
	else if (strcasecmp(source, "prom") == 0)
		result = vbios_extract_prom(cnum, vbios, &length);
	else {
		fprintf(stderr, "Unknown vbios extraction method.\n");
		usage(1);
	}

	if (isatty(fileno(stdout))) {
		fprintf(stderr, "Refusing to write BIOS image to a terminal - please redirect output to a file.\n");
	} else {
		/* print the vbios on stdout */
		fwrite(vbios, 1, length, stdout);
	}

	strap_peek = extract_strap_peek(cnum);
	if (isatty(fileno(strap_peek_output))) {
		fprintf(strap_peek_output,
			"Your strap peek is: 0x%x\n"
			"Please save this value in the same directory as your vbios as a file named strap_peek (or use -S)\n",
			strap_peek);
	} else {
		fprintf(strap_peek_output, "0x%x", strap_peek);
	}

	if (result == EOK)
		fprintf(stderr, "Vbios extracted successfully!\n");
	else if (result == ESIG)
		fprintf(stderr, "Vbios extracted but it may be corrupted!\n");

	return result != EOK;
}